

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib506.c
# Opt level: O2

int test(char *URL)

{
  undefined8 *puVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  curl_slist *pcVar6;
  char *pcVar7;
  char *headers;
  curl_slist **ppcVar8;
  curl_slist *cookies;
  userdata user;
  
  ppcVar8 = &cookies;
  cookies = (curl_slist *)0x0;
  user.text = "Pigs in space";
  user.counter = 0;
  curl_mprintf("GLOBAL_INIT\n");
  iVar2 = curl_global_init(3);
  if (iVar2 != 0) {
    curl_mfprintf(_stderr,"curl_global_init() failed\n");
    return 0x7e;
  }
  curl_mprintf("SHARE_INIT\n");
  lVar4 = curl_share_init();
  if (lVar4 == 0) {
    curl_mfprintf(_stderr,"curl_share_init() failed\n");
    goto LAB_001013df;
  }
  curl_mprintf("CURLSHOPT_LOCKFUNC\n");
  iVar2 = curl_share_setopt(lVar4,3,my_lock);
  if (iVar2 == 0) {
    curl_mprintf("CURLSHOPT_UNLOCKFUNC\n");
    iVar2 = curl_share_setopt(lVar4,4,my_unlock);
    if (iVar2 != 0) goto LAB_001013a5;
    curl_mprintf("CURLSHOPT_USERDATA\n");
    iVar2 = curl_share_setopt(lVar4,5,&user);
    if (iVar2 != 0) goto LAB_001013a5;
    curl_mprintf("CURL_LOCK_DATA_COOKIE\n");
    iVar2 = curl_share_setopt(lVar4,1,2);
    if (iVar2 != 0) goto LAB_001013a5;
    curl_mprintf("CURL_LOCK_DATA_DNS\n");
    iVar2 = 1;
    iVar3 = curl_share_setopt(lVar4,1,3);
    if (iVar3 != 0) goto LAB_001013a5;
    lVar5 = curl_easy_init();
    if (lVar5 != 0) {
      curl_mprintf("CURLOPT_SHARE\n");
      iVar3 = curl_easy_setopt(lVar5,0x2774,lVar4);
      if (iVar3 == 0) {
        curl_mprintf("CURLOPT_COOKIELIST injected_and_clobbered\n");
        iVar3 = curl_easy_setopt(lVar5,0x2797,
                                 "Set-Cookie: injected_and_clobbered=yes; domain=host.foo.com; expires=Sat Feb 2 11:56:27 GMT 2030"
                                );
        if (iVar3 == 0) {
          curl_mprintf("CURLOPT_COOKIELIST ALL\n");
          iVar3 = curl_easy_setopt(lVar5,0x2797,"ALL");
          if (iVar3 == 0) {
            curl_mprintf("CURLOPT_COOKIELIST session\n");
            iVar3 = curl_easy_setopt(lVar5,0x2797,"Set-Cookie: session=elephants");
            if (iVar3 == 0) {
              curl_mprintf("CURLOPT_COOKIELIST injected\n");
              iVar3 = curl_easy_setopt(lVar5,0x2797,
                                       "Set-Cookie: injected=yes; domain=host.foo.com; expires=Sat Feb 2 11:56:27 GMT 2030"
                                      );
              if (iVar3 == 0) {
                curl_mprintf("CURLOPT_COOKIELIST SESS\n");
                iVar3 = curl_easy_setopt(lVar5,0x2797,"SESS");
                if (iVar3 == 0) {
                  curl_mprintf("CLEANUP\n");
                  curl_easy_cleanup(lVar5);
                  for (; iVar2 != 3; iVar2 = iVar2 + 1) {
                    pcVar7 = suburl(URL,iVar2);
                    headers = "*** run %d\n";
                    curl_mprintf("*** run %d\n",iVar2);
                    lVar5 = curl_easy_init();
                    if (lVar5 == 0) {
                      curl_mfprintf(_stderr,"curl_easy_init() failed\n");
                    }
                    else {
                      pcVar6 = sethost((curl_slist *)headers);
                      curl_easy_setopt(lVar5,0x29,1);
                      curl_easy_setopt(lVar5,0x2727,pcVar6);
                      curl_easy_setopt(lVar5,0x2712,pcVar7);
                      curl_easy_setopt(lVar5,0x272f,"");
                      curl_mprintf("CURLOPT_SHARE\n");
                      curl_easy_setopt(lVar5,0x2774,lVar4);
                      curl_mprintf("PERFORM\n");
                      iVar3 = curl_easy_perform(lVar5);
                      if (iVar3 != 0) {
                        curl_mfprintf(_stderr,"perform url \'%s\' repeat %d failed, curlcode %d\n",
                                      pcVar7,0,iVar3);
                      }
                      curl_mprintf("CLEANUP\n");
                      curl_easy_cleanup(lVar5);
                      curl_slist_free_all(pcVar6);
                    }
                    curl_free(pcVar7);
                  }
                  curl_mprintf("*** run %d\n",3);
                  lVar5 = curl_easy_init();
                  if (lVar5 != 0) {
                    pcVar6 = (curl_slist *)URL;
                    pcVar7 = suburl(URL,3);
                    pcVar6 = sethost(pcVar6);
                    iVar3 = curl_easy_setopt(lVar5,0x2727,pcVar6);
                    if ((iVar3 != 0) || (iVar3 = curl_easy_setopt(lVar5,0x2712,pcVar7), iVar3 != 0))
                    goto LAB_00101518;
                    curl_mprintf("CURLOPT_SHARE\n");
                    iVar3 = curl_easy_setopt(lVar5,0x2774,lVar4);
                    if (iVar3 != 0) goto LAB_00101518;
                    curl_mprintf("CURLOPT_COOKIEJAR\n");
                    iVar3 = curl_easy_setopt(lVar5,0x2762,"log/jar506");
                    if (iVar3 != 0) goto LAB_00101518;
                    curl_mprintf("CURLOPT_COOKIELIST FLUSH\n");
                    iVar3 = curl_easy_setopt(lVar5,0x2797,"FLUSH");
                    if (iVar3 != 0) goto LAB_00101518;
                    curl_mprintf("PERFORM\n");
                    curl_easy_perform(lVar5);
                    curl_mprintf("CLEANUP\n");
                    curl_easy_cleanup(lVar5);
                    curl_free(pcVar7);
                    curl_slist_free_all(pcVar6);
                    lVar5 = curl_easy_init();
                    if (lVar5 != 0) {
                      pcVar7 = suburl(URL,3);
                      pcVar6 = sethost((curl_slist *)URL);
                      iVar3 = curl_easy_setopt(lVar5,0x2727,pcVar6);
                      if ((iVar3 == 0) &&
                         (iVar3 = curl_easy_setopt(lVar5,0x2712,pcVar7), iVar3 == 0)) {
                        curl_mprintf("CURLOPT_SHARE\n");
                        iVar3 = curl_easy_setopt(lVar5,0x2774,lVar4);
                        if (iVar3 == 0) {
                          curl_mprintf("CURLOPT_COOKIELIST ALL\n");
                          iVar3 = curl_easy_setopt(lVar5,0x2797,"ALL");
                          if (iVar3 == 0) {
                            curl_mprintf("CURLOPT_COOKIEJAR\n");
                            iVar3 = curl_easy_setopt(lVar5,0x272f,"log/jar506");
                            if (iVar3 == 0) {
                              curl_mprintf("CURLOPT_COOKIELIST RELOAD\n");
                              iVar3 = curl_easy_setopt(lVar5,0x2797,"RELOAD");
                              if (iVar3 == 0) {
                                iVar2 = curl_easy_getinfo(lVar5,0x40001c,&cookies);
                                if (iVar2 == 0) {
                                  curl_mprintf("loaded cookies:\n");
                                  if (cookies != (curl_slist *)0x0) {
                                    curl_mprintf("-----------------\n");
                                    while (puVar1 = &(*ppcVar8)->data, puVar1 != (undefined8 *)0x0)
                                    {
                                      curl_mprintf("  %s\n",*puVar1);
                                      ppcVar8 = (curl_slist **)(puVar1 + 1);
                                    }
                                    iVar3 = 0;
                                    curl_mprintf("-----------------\n");
                                    curl_slist_free_all(cookies);
                                    curl_mprintf("try SHARE_CLEANUP...\n");
                                    iVar2 = curl_share_cleanup(lVar4);
                                    if (iVar2 == 0) {
                                      iVar3 = 0;
                                      curl_mfprintf(_stderr,
                                                  "curl_share_cleanup succeed but error expected\n")
                                      ;
                                      lVar4 = 0;
                                    }
                                    else {
                                      curl_mprintf("SHARE_CLEANUP failed, correct\n");
                                    }
                                    goto LAB_00101518;
                                  }
                                  curl_mfprintf(_stderr,"  reloading cookies from \'%s\' failed\n",
                                                "log/jar506");
                                }
                                else {
                                  curl_mfprintf(_stderr,"curl_easy_getinfo() failed\n");
                                }
                                iVar3 = 0x7e;
                              }
                            }
                          }
                        }
                      }
                      goto LAB_00101518;
                    }
                  }
                  goto LAB_00101929;
                }
              }
            }
          }
        }
      }
      pcVar7 = (char *)0x0;
      pcVar6 = (curl_slist *)0x0;
LAB_00101518:
      curl_mprintf("CLEANUP\n");
      curl_easy_cleanup(lVar5);
      curl_slist_free_all(pcVar6);
      curl_free(pcVar7);
      curl_mprintf("SHARE_CLEANUP\n");
      iVar2 = curl_share_cleanup(lVar4);
      if (iVar2 != 0) {
        curl_mfprintf(_stderr,"curl_share_cleanup failed, code errno %d\n",iVar2);
      }
      curl_mprintf("GLOBAL_CLEANUP\n");
      curl_global_cleanup();
      return iVar3;
    }
LAB_00101929:
    pcVar7 = "curl_easy_init() failed\n";
  }
  else {
LAB_001013a5:
    pcVar7 = "curl_share_setopt() failed\n";
  }
  curl_mfprintf(_stderr,pcVar7);
  curl_share_cleanup(lVar4);
LAB_001013df:
  curl_global_cleanup();
  return 0x7e;
}

Assistant:

int test(char *URL)
{
  int res;
  CURLSHcode scode = CURLSHE_OK;
  CURLcode code = CURLE_OK;
  char *url = NULL;
  struct Tdata tdata;
  CURL *curl;
  CURLSH *share;
  struct curl_slist *headers = NULL;
  struct curl_slist *cookies = NULL;
  struct curl_slist *next_cookie = NULL;
  int i;
  struct userdata user;

  user.text = "Pigs in space";
  user.counter = 0;

  printf("GLOBAL_INIT\n");
  if(curl_global_init(CURL_GLOBAL_ALL) != CURLE_OK) {
    fprintf(stderr, "curl_global_init() failed\n");
    return TEST_ERR_MAJOR_BAD;
  }

  /* prepare share */
  printf("SHARE_INIT\n");
  share = curl_share_init();
  if(!share) {
    fprintf(stderr, "curl_share_init() failed\n");
    curl_global_cleanup();
    return TEST_ERR_MAJOR_BAD;
  }

  if(CURLSHE_OK == scode) {
    printf("CURLSHOPT_LOCKFUNC\n");
    scode = curl_share_setopt(share, CURLSHOPT_LOCKFUNC, my_lock);
  }
  if(CURLSHE_OK == scode) {
    printf("CURLSHOPT_UNLOCKFUNC\n");
    scode = curl_share_setopt(share, CURLSHOPT_UNLOCKFUNC, my_unlock);
  }
  if(CURLSHE_OK == scode) {
    printf("CURLSHOPT_USERDATA\n");
    scode = curl_share_setopt(share, CURLSHOPT_USERDATA, &user);
  }
  if(CURLSHE_OK == scode) {
    printf("CURL_LOCK_DATA_COOKIE\n");
    scode = curl_share_setopt(share, CURLSHOPT_SHARE, CURL_LOCK_DATA_COOKIE);
  }
  if(CURLSHE_OK == scode) {
    printf("CURL_LOCK_DATA_DNS\n");
    scode = curl_share_setopt(share, CURLSHOPT_SHARE, CURL_LOCK_DATA_DNS);
  }

  if(CURLSHE_OK != scode) {
    fprintf(stderr, "curl_share_setopt() failed\n");
    curl_share_cleanup(share);
    curl_global_cleanup();
    return TEST_ERR_MAJOR_BAD;
  }

  /* initial cookie manipulation */
  curl = curl_easy_init();
  if(!curl) {
    fprintf(stderr, "curl_easy_init() failed\n");
    curl_share_cleanup(share);
    curl_global_cleanup();
    return TEST_ERR_MAJOR_BAD;
  }
  printf("CURLOPT_SHARE\n");
  test_setopt(curl, CURLOPT_SHARE,      share);
  printf("CURLOPT_COOKIELIST injected_and_clobbered\n");
  test_setopt(curl, CURLOPT_COOKIELIST,
               "Set-Cookie: injected_and_clobbered=yes; "
               "domain=host.foo.com; expires=Sat Feb 2 11:56:27 GMT 2030");
  printf("CURLOPT_COOKIELIST ALL\n");
  test_setopt(curl, CURLOPT_COOKIELIST, "ALL");
  printf("CURLOPT_COOKIELIST session\n");
  test_setopt(curl, CURLOPT_COOKIELIST, "Set-Cookie: session=elephants");
  printf("CURLOPT_COOKIELIST injected\n");
  test_setopt(curl, CURLOPT_COOKIELIST,
               "Set-Cookie: injected=yes; domain=host.foo.com; "
               "expires=Sat Feb 2 11:56:27 GMT 2030");
  printf("CURLOPT_COOKIELIST SESS\n");
  test_setopt(curl, CURLOPT_COOKIELIST, "SESS");
  printf("CLEANUP\n");
  curl_easy_cleanup(curl);


  res = 0;

  /* start treads */
  for(i = 1; i <= THREADS; i++) {

    /* set thread data */
    tdata.url   = suburl(URL, i); /* must be curl_free()d */
    tdata.share = share;

    /* simulate thread, direct call of "thread" function */
    printf("*** run %d\n",i);
    fire(&tdata);

    curl_free(tdata.url);
  }


  /* fetch a another one and save cookies */
  printf("*** run %d\n", i);
  curl = curl_easy_init();
  if(!curl) {
    fprintf(stderr, "curl_easy_init() failed\n");
    curl_share_cleanup(share);
    curl_global_cleanup();
    return TEST_ERR_MAJOR_BAD;
  }

  url = suburl(URL, i);
  headers = sethost(NULL);
  test_setopt(curl, CURLOPT_HTTPHEADER, headers);
  test_setopt(curl, CURLOPT_URL,        url);
  printf("CURLOPT_SHARE\n");
  test_setopt(curl, CURLOPT_SHARE,      share);
  printf("CURLOPT_COOKIEJAR\n");
  test_setopt(curl, CURLOPT_COOKIEJAR,  JAR);
  printf("CURLOPT_COOKIELIST FLUSH\n");
  test_setopt(curl, CURLOPT_COOKIELIST, "FLUSH");

  printf("PERFORM\n");
  curl_easy_perform(curl);

  printf("CLEANUP\n");
  curl_easy_cleanup(curl);
  curl_free(url);
  curl_slist_free_all(headers);

  /* load cookies */
  curl = curl_easy_init();
  if(!curl) {
    fprintf(stderr, "curl_easy_init() failed\n");
    curl_share_cleanup(share);
    curl_global_cleanup();
    return TEST_ERR_MAJOR_BAD;
  }
  url = suburl(URL, i);
  headers = sethost(NULL);
  test_setopt(curl, CURLOPT_HTTPHEADER, headers);
  test_setopt(curl, CURLOPT_URL,        url);
  printf("CURLOPT_SHARE\n");
  test_setopt(curl, CURLOPT_SHARE,      share);
  printf("CURLOPT_COOKIELIST ALL\n");
  test_setopt(curl, CURLOPT_COOKIELIST, "ALL");
  printf("CURLOPT_COOKIEJAR\n");
  test_setopt(curl, CURLOPT_COOKIEFILE, JAR);
  printf("CURLOPT_COOKIELIST RELOAD\n");
  test_setopt(curl, CURLOPT_COOKIELIST, "RELOAD");

  code = curl_easy_getinfo(curl, CURLINFO_COOKIELIST, &cookies);
  if(code != CURLE_OK) {
    fprintf(stderr, "curl_easy_getinfo() failed\n");
    res = TEST_ERR_MAJOR_BAD;
    goto test_cleanup;
  }
  printf("loaded cookies:\n");
  if(!cookies) {
    fprintf(stderr, "  reloading cookies from '%s' failed\n", JAR);
    res = TEST_ERR_MAJOR_BAD;
    goto test_cleanup;
  }
  printf("-----------------\n");
  next_cookie = cookies;
  while(next_cookie) {
    printf("  %s\n", next_cookie->data);
    next_cookie = next_cookie->next;
  }
  printf("-----------------\n");
  curl_slist_free_all(cookies);

  /* try to free share, expect to fail because share is in use*/
  printf("try SHARE_CLEANUP...\n");
  scode = curl_share_cleanup(share);
  if(scode == CURLSHE_OK) {
    fprintf(stderr, "curl_share_cleanup succeed but error expected\n");
    share = NULL;
  }
  else {
    printf("SHARE_CLEANUP failed, correct\n");
  }

test_cleanup:

  /* clean up last handle */
  printf("CLEANUP\n");
  curl_easy_cleanup(curl);
  curl_slist_free_all(headers);
  curl_free(url);

  /* free share */
  printf("SHARE_CLEANUP\n");
  scode = curl_share_cleanup(share);
  if(scode != CURLSHE_OK)
    fprintf(stderr, "curl_share_cleanup failed, code errno %d\n",
            (int)scode);

  printf("GLOBAL_CLEANUP\n");
  curl_global_cleanup();

  return res;
}